

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O2

Am_Object Am_Create_Search_Dialog_For(Am_Object *main_undo_handler)

{
  Am_Slot_Key AVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Value_List *list;
  Am_Wrapper *pAVar4;
  Am_Object *pAVar5;
  int iVar6;
  Am_Object *in_RSI;
  undefined1 local_118 [8];
  int current_y;
  Am_Object_Data *local_108;
  Am_Value_List pos_slots;
  Am_Value a;
  Am_Value_List all_slots;
  Am_Object group;
  Am_Value_List slots_to_item;
  Am_Assoc as;
  Am_Object proto;
  Am_Value_List color_slots;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Value_List slots_values;
  Am_Value v;
  Am_Value_List all_types;
  Am_Value_List local_all_slots;
  
  local_108 = (Am_Object_Data *)main_undo_handler;
  Am_Object::Create(main_undo_handler,(char *)&Am_Search_Window);
  Am_Value_List::Am_Value_List(&all_slots);
  proto.data = (Am_Object_Data *)0x0;
  as.data = (Am_Assoc_Data *)0x0;
  Am_Value_List::Am_Value_List(&local_all_slots);
  Am_Value_List::Am_Value_List(&all_types);
  Am_Value_List::Am_Value_List(&slots_values);
  v.type = 0;
  v.value.wrapper_value = (Am_Wrapper *)0x0;
  Am_Value_List::Start(&am_all_proto_names);
  while( true ) {
    bVar2 = Am_Value_List::Last(&am_all_proto_names);
    if (bVar2) break;
    pAVar3 = Am_Value_List::Get(&am_all_proto_names);
    Am_Assoc::operator=(&as,pAVar3);
    Am_Assoc::Value_2((Am_Assoc *)&pos_slots);
    Am_Object::operator=(&proto,(Am_Value *)&pos_slots);
    Am_Value::~Am_Value((Am_Value *)&pos_slots);
    pAVar3 = Am_Object::Get(&proto,0xb8,0);
    Am_Value_List::operator=(&local_all_slots,pAVar3);
    list = Am_Value_List::Append_New(&all_slots,&local_all_slots,true);
    Am_Value_List::operator=(&all_slots,list);
    Am_Value_List::Start(&local_all_slots);
    while( true ) {
      bVar2 = Am_Value_List::Last(&local_all_slots);
      if (bVar2) break;
      pAVar3 = Am_Value_List::Get(&local_all_slots);
      Am_Am_Slot_Key::Am_Am_Slot_Key((Am_Am_Slot_Key *)&color_slots,pAVar3);
      a.value.long_value._2_6_ = 0;
      a.value.long_value._0_2_ = (ushort)color_slots.data;
      a.type = 0x4015;
      Am_Value_List::Assoc_2(&pos_slots,(Am_Value *)&slots_values);
      bVar2 = Am_Value::Exists((Am_Value *)&pos_slots);
      Am_Value::~Am_Value((Am_Value *)&pos_slots);
      Am_Value::~Am_Value(&a);
      if (!bVar2) {
        pAVar3 = Am_Object::Get(&proto,(ushort)color_slots.data,1);
        Am_Value::operator=(&v,pAVar3);
        bVar2 = Am_Value::Exists(&v);
        if (!bVar2) {
          Am_Value::operator=(&v,0);
        }
        pos_slots.item = (Am_List_Item *)(ulong)(ushort)color_slots.data;
        pos_slots.data._0_2_ = 0x4015;
        Am_Assoc::Am_Assoc((Am_Assoc *)&a,(Am_Value *)&pos_slots,&v);
        pAVar4 = Am_Assoc::operator_cast_to_Am_Wrapper_((Am_Assoc *)&a);
        Am_Value_List::Add(&slots_values,pAVar4,Am_TAIL,true);
        Am_Assoc::~Am_Assoc((Am_Assoc *)&a);
        Am_Value::~Am_Value((Am_Value *)&pos_slots);
      }
      Am_Value_List::Next(&local_all_slots);
    }
    Am_Object::Create((Am_Object *)&a,(char *)&Am_Command);
    pAVar5 = Am_Object::Set((Am_Object *)&a,0xca,new_item_value.from_wrapper,0);
    Am_Assoc::Value_1((Am_Assoc *)&pos_slots);
    pAVar5 = Am_Object::Set(pAVar5,0x150,(Am_Value *)&pos_slots,0);
    pAVar5 = Am_Object::Set(pAVar5,0x154,-1,0);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&proto);
    pAVar5 = Am_Object::Set(pAVar5,0x153,pAVar4,0);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar5);
    Am_Value_List::Add(&all_types,pAVar4,Am_TAIL,true);
    Am_Value::~Am_Value((Am_Value *)&pos_slots);
    Am_Object::~Am_Object((Am_Object *)&a);
    Am_Value_List::Next(&am_all_proto_names);
  }
  Am_Value_List::Am_Value_List(&pos_slots);
  a.type = 0;
  a.value.wrapper_value = (Am_Wrapper *)0x0;
  am_check_list_slot(100,&a,&Am_No_Object,&all_slots,&pos_slots);
  am_check_list_slot(0x65,&a,&Am_No_Object,&all_slots,&pos_slots);
  am_check_list_slot(0x66,&a,&Am_No_Object,&all_slots,&pos_slots);
  am_check_list_slot(0x67,&a,&Am_No_Object,&all_slots,&pos_slots);
  am_check_list_slot(0x8b,&a,&Am_No_Object,&all_slots,&pos_slots);
  am_check_list_slot(0x8c,&a,&Am_No_Object,&all_slots,&pos_slots);
  am_check_list_slot(0x8d,&a,&Am_No_Object,&all_slots,&pos_slots);
  am_check_list_slot(0x8e,&a,&Am_No_Object,&all_slots,&pos_slots);
  Am_Value_List::Am_Value_List(&color_slots);
  am_check_list_slot(0x6a,&a,&Am_No_Object,&all_slots,&color_slots);
  am_check_list_slot(0x6b,&a,&Am_No_Object,&all_slots,&color_slots);
  Am_Object::Get_Object((Am_Object *)&slots_to_item,(Am_Slot_Key)local_108,(ulong)Am_TYPE_USE_ITEM);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&all_types);
  Am_Object::Set((Am_Object *)&slots_to_item,0xa2,pAVar4,0);
  Am_Object::~Am_Object((Am_Object *)&slots_to_item);
  Am_Value_List::Am_Value_List(&slots_to_item);
  group.data._0_2_ = 0x4015;
  Am_Object::Get_Object((Am_Object *)&current_y,(Am_Slot_Key)local_108,(ulong)Am_TYPE_USE_ITEM);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&current_y);
  Am_Assoc::Am_Assoc((Am_Assoc *)local_118,(Am_Value *)&group,pAVar4);
  pAVar4 = Am_Assoc::operator_cast_to_Am_Wrapper_((Am_Assoc *)local_118);
  Am_Value_List::Add(&slots_to_item,pAVar4,Am_TAIL,true);
  Am_Assoc::~Am_Assoc((Am_Assoc *)local_118);
  Am_Object::~Am_Object((Am_Object *)&current_y);
  Am_Value::~Am_Value((Am_Value *)&group);
  group.data = (Am_Object_Data *)0x0;
  current_y = 0x88;
  bVar2 = Am_Value_List::Valid(&pos_slots);
  iVar6 = 0x8d;
  if (bVar2) {
    generate_search_group
              ((Am_Value_List *)local_118,(char *)&pos_slots,(int *)0x285f91,SUB81(&current_y,0),
               (Am_Value_List *)0x0,&slots_to_item);
    Am_Object::operator=(&group,(Am_Object *)local_118);
    Am_Object::~Am_Object((Am_Object *)local_118);
    Am_Object::Am_Object(&local_78,&group);
    Am_Object::Add_Part((Am_Object *)local_108,&local_78,true,0);
    Am_Object::~Am_Object(&local_78);
    iVar6 = current_y + 5;
  }
  current_y = iVar6;
  bVar2 = Am_Value_List::Valid(&color_slots);
  if (bVar2) {
    generate_search_group
              ((Am_Value_List *)local_118,(char *)&color_slots,(int *)"Colors",SUB81(&current_y,0),
               (Am_Value_List *)0x0,&slots_to_item);
    Am_Object::operator=(&group,(Am_Object *)local_118);
    Am_Object::~Am_Object((Am_Object *)local_118);
    Am_Object::Am_Object(&local_80,&group);
    Am_Object::Add_Part((Am_Object *)local_108,&local_80,true,0);
    Am_Object::~Am_Object(&local_80);
    iVar6 = current_y;
  }
  current_y = iVar6 + 5;
  bVar2 = Am_Value_List::Valid(&all_slots);
  iVar6 = iVar6 + 5;
  if (bVar2) {
    generate_search_group
              ((Am_Value_List *)local_118,(char *)&all_slots,(int *)"Other",SUB81(&current_y,0),
               (Am_Value_List *)0x0,&slots_to_item);
    Am_Object::operator=(&group,(Am_Object *)local_118);
    Am_Object::~Am_Object((Am_Object *)local_118);
    Am_Object::Am_Object(&local_88,&group);
    Am_Object::Add_Part((Am_Object *)local_108,&local_88,true,0);
    Am_Object::~Am_Object(&local_88);
    iVar6 = current_y;
  }
  current_y = iVar6 + 5;
  add_bottom_part((Am_Object *)local_108,&current_y);
  Am_Object::Set((Am_Object *)local_108,0x67,current_y,0);
  AVar1 = Am_SLOTS_TO_ITEMS;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&slots_to_item);
  Am_Object::Set((Am_Object *)local_108,AVar1,pAVar4,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(in_RSI);
  Am_Object::Set((Am_Object *)local_108,0x174,pAVar4,0);
  bVar2 = Am_Object::Valid(in_RSI);
  AVar1 = Am_SEARCH_DIALOG;
  if (bVar2) {
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)local_108);
    Am_Object::Set(in_RSI,AVar1,pAVar4,1);
  }
  Am_Object::~Am_Object(&group);
  Am_Value_List::~Am_Value_List(&slots_to_item);
  Am_Value_List::~Am_Value_List(&color_slots);
  Am_Value::~Am_Value(&a);
  Am_Value_List::~Am_Value_List(&pos_slots);
  Am_Value::~Am_Value(&v);
  Am_Value_List::~Am_Value_List(&slots_values);
  Am_Value_List::~Am_Value_List(&all_types);
  Am_Value_List::~Am_Value_List(&local_all_slots);
  Am_Assoc::~Am_Assoc(&as);
  Am_Object::~Am_Object(&proto);
  Am_Value_List::~Am_Value_List(&all_slots);
  return (Am_Object)local_108;
}

Assistant:

Am_Object
Am_Create_Search_Dialog_For(/* Am_Load_Save_Context& ls_context, */
                            Am_Object &main_undo_handler)
{
  Am_Object this_search_window = Am_Search_Window.Create();
  Am_Value_List all_slots;
  Am_Object proto;
  Am_Assoc as;
  Am_Value_List local_all_slots;
  Am_Value_List all_types;
  Am_Value_List slots_values;
  Am_Value v;
  for (am_all_proto_names.Start(); !am_all_proto_names.Last();
       am_all_proto_names.Next()) {
    as = am_all_proto_names.Get();
    proto = as.Value_2();
    local_all_slots = proto.Get(Am_SLOTS_TO_SAVE);
    all_slots = all_slots.Append_New(local_all_slots);
    for (local_all_slots.Start(); !local_all_slots.Last();
         local_all_slots.Next()) {
      Am_Am_Slot_Key this_slot = local_all_slots.Get();
      if (!(slots_values.Assoc_2(this_slot).Exists())) {
        v = proto.Get(this_slot, Am_OK_IF_NOT_THERE);
        if (!v.Exists())
          v = 0;
        slots_values.Add(Am_Assoc(this_slot, v));
      }
    }

    all_types.Add(Am_Command.Create()
                      .Set(Am_DO_METHOD, new_item_value)
                      .Set(Am_LABEL, as.Value_1())
                      .Set(Am_IMPLEMENTATION_PARENT, Am_NOT_USUALLY_UNDONE)
                      .Set(Am_ID, proto));
  }
  Am_Value_List pos_slots;
  Am_Value a;
  am_check_list_slot(Am_LEFT, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_TOP, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_WIDTH, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_HEIGHT, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_X1, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_Y1, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_X2, a, Am_No_Object, all_slots, pos_slots);
  am_check_list_slot(Am_Y2, a, Am_No_Object, all_slots, pos_slots);
  Am_Value_List color_slots;
  am_check_list_slot(Am_FILL_STYLE, a, Am_No_Object, all_slots, color_slots);
  am_check_list_slot(Am_LINE_STYLE, a, Am_No_Object, all_slots, color_slots);

  this_search_window.Get_Object(Am_TYPE_USE_ITEM).Set(Am_ITEMS, all_types);
  Am_Value_List slots_to_item;
  slots_to_item.Add(Am_Assoc(Am_Am_Slot_Key(Am_PROTOTYPE),
                             this_search_window.Get_Object(Am_TYPE_USE_ITEM)));

  Am_Object group;

  int current_y = 136;
  //  Generate the location section
  if (pos_slots.Valid()) {
    group = generate_search_group(pos_slots, "Location", current_y, false,
                                  slots_to_item, slots_values);
    this_search_window.Add_Part(group);
  }
  current_y += OFFSET;

  //  Generate the color section
  if (color_slots.Valid()) {
    group = generate_search_group(color_slots, "Colors", current_y, false,
                                  slots_to_item, slots_values);
    this_search_window.Add_Part(group);
  }
  current_y += OFFSET;

  //  Generate the "other" section
  if (all_slots.Valid()) {
    group = generate_search_group(all_slots, "Other", current_y, false,
                                  slots_to_item, slots_values);
    this_search_window.Add_Part(group);
  }
  current_y += OFFSET;
  add_bottom_part(this_search_window, current_y);
  this_search_window.Set(Am_HEIGHT, current_y);
  this_search_window.Set(Am_SLOTS_TO_ITEMS, slots_to_item);
  this_search_window.Set(Am_UNDO_HANDLER, main_undo_handler);
  if (main_undo_handler.Valid())
    main_undo_handler.Set(Am_SEARCH_DIALOG, this_search_window,
                          Am_OK_IF_NOT_THERE);
  return this_search_window;
}